

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catmullclark_patch.h
# Opt level: O1

void __thiscall
embree::GeneralCatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>::subdivide
          (GeneralCatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa> *this,
          array_t<embree::CatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>,_16UL> *patch,uint *N_o
          )

{
  DynamicStackArray<float,_16UL,_64UL> *pDVar1;
  uint *puVar2;
  DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *pDVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa> *pGVar6;
  Vec3fa *pVVar7;
  Face *pFVar8;
  GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa> *pGVar9;
  long *plVar10;
  undefined1 auVar11 [16];
  undefined8 uVar12;
  long lVar13;
  undefined8 uVar14;
  array_t<embree::CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>,_4UL> *paVar15;
  size_t i;
  long lVar16;
  Vec3fa *pVVar17;
  float *pfVar18;
  size_t k;
  ulong uVar19;
  Vec3fa **ppVVar20;
  ulong uVar21;
  ulong uVar22;
  CatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa> *pCVar23;
  ulong uVar24;
  DynamicStackArray<float,_16UL,_64UL> *pDVar25;
  uint uVar26;
  DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *pDVar27;
  ulong uVar28;
  uint uVar29;
  long lVar30;
  uint uVar31;
  ulong uVar32;
  ulong uVar33;
  int iVar34;
  bool bVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar44;
  float fVar45;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  Vec3fa VVar43;
  float fVar46;
  undefined1 auVar47 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  array_t<embree::Vec3fa,_32UL> center_ring;
  undefined8 local_238;
  long local_230;
  float afStack_228 [2];
  undefined8 auStack_220 [62];
  
  *N_o = this->N;
  uVar28 = (ulong)this->N;
  if (this->N != 0) {
    pDVar27 = &patch->items[0].ring.items[0].ring;
    pDVar25 = &patch->items[0].ring.items[0].crease_weight;
    uVar33 = 0;
    do {
      pGVar6 = (this->ring).data;
      pGVar9 = pGVar6 + uVar33;
      patch->items[uVar33].ring.items[0].edge_level = pGVar6[uVar33].edge_level * 0.5;
      patch->items[uVar33].ring.items[0].vertex_level = pGVar6[uVar33].vertex_level * 0.5;
      patch->items[uVar33].ring.items[0].face_valence = pGVar6[uVar33].face_valence;
      patch->items[uVar33].ring.items[0].edge_valence = pGVar6[uVar33].face_valence * 2;
      iVar34 = pGVar6[uVar33].border_face * 2;
      if (pGVar6[uVar33].border_face == -1) {
        iVar34 = -1;
      }
      patch->items[uVar33].ring.items[0].border_index = iVar34;
      fVar36 = pGVar6[uVar33].vertex_crease_weight + -1.0;
      if (fVar36 <= 0.0) {
        fVar36 = 0.0;
      }
      patch->items[uVar33].ring.items[0].vertex_crease_weight = fVar36;
      patch->items[uVar33].ring.items[0].eval_start_index = pGVar6[uVar33].eval_start_face_index;
      patch->items[uVar33].ring.items[0].eval_unique_identifier =
           pGVar6[uVar33].eval_unique_identifier;
      uVar21 = (ulong)pGVar6[uVar33].face_valence;
      fVar36 = 0.0;
      fVar49 = 0.0;
      fVar50 = 0.0;
      fVar51 = 0.0;
      if (uVar21 != 0) {
        uVar22 = (ulong)pGVar9->eval_start_vertex_index;
        uVar32 = 0;
        do {
          uVar21 = (pGVar9->eval_start_face_index + uVar32) % uVar21;
          auVar42 = *(undefined1 (*) [16])(pGVar9->vtx).field_0.m128;
          iVar34 = (pGVar9->faces).data[uVar21].size;
          if (!CARRY8(uVar22,(long)iVar34)) {
            uVar19 = uVar22;
            auVar41 = auVar42;
            do {
              pVVar17 = (pGVar9->ring).data + uVar19 % (ulong)pGVar9->edge_valence;
              auVar42._0_4_ = auVar41._0_4_ + (pVVar17->field_0).m128[0];
              auVar42._4_4_ = auVar41._4_4_ + (pVVar17->field_0).m128[1];
              auVar42._8_4_ = auVar41._8_4_ + (pVVar17->field_0).m128[2];
              auVar42._12_4_ = auVar41._12_4_ + (pVVar17->field_0).m128[3];
              uVar19 = uVar19 + 1;
              auVar41 = auVar42;
            } while (uVar19 <= uVar22 + (long)iVar34);
          }
          if ((0xf < uVar21) &&
             ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)
              patch->items[uVar33].ring.items[0].ring.data ==
              &patch->items[uVar33].ring.items[0].ring)) {
            pVVar17 = (Vec3fa *)alignedMalloc(0x800,0x10);
            patch->items[uVar33].ring.items[0].ring.data = pVVar17;
            lVar30 = 0;
            do {
              puVar5 = (undefined8 *)((long)&pDVar27->arr[0].field_0 + lVar30);
              uVar12 = puVar5[1];
              puVar4 = (undefined8 *)
                       ((long)&(patch->items[uVar33].ring.items[0].ring.data)->field_0 + lVar30);
              *puVar4 = *puVar5;
              puVar4[1] = uVar12;
              lVar30 = lVar30 + 0x10;
            } while (lVar30 != 0x200);
          }
          fVar37 = (float)(iVar34 + 2);
          auVar41._4_4_ = fVar37;
          auVar41._0_4_ = fVar37;
          auVar41._8_4_ = fVar37;
          auVar41._12_4_ = fVar37;
          VVar43.field_0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)divps(auVar42,auVar41);
          patch->items[uVar33].ring.items[0].ring.data[uVar21 * 2 + 1].field_0 = VVar43.field_0;
          fVar36 = fVar36 + VVar43.field_0._0_4_;
          fVar49 = fVar49 + VVar43.field_0._4_4_;
          fVar50 = fVar50 + VVar43.field_0._8_4_;
          fVar51 = fVar51 + VVar43.field_0._12_4_;
          uVar22 = (uVar22 + (long)(pGVar9->faces).data[uVar21].size) % (ulong)pGVar9->edge_valence;
          uVar32 = uVar32 + 1;
          uVar21 = (ulong)pGVar9->face_valence;
        } while (uVar32 < uVar21);
      }
      fVar54 = 0.0;
      fVar53 = 0.0;
      fVar52 = 0.0;
      fVar37 = 0.0;
      uVar21 = (ulong)pGVar9->face_valence;
      if (uVar21 == 0) {
        uVar22 = 0;
        uVar21 = 0;
      }
      else {
        uVar32 = (ulong)pGVar9->eval_start_vertex_index;
        pDVar3 = &patch->items[uVar33].ring.items[0].ring;
        fVar37 = 0.0;
        fVar52 = 0.0;
        fVar53 = 0.0;
        fVar54 = 0.0;
        uVar22 = 0;
        uVar19 = 0;
        do {
          uVar21 = (pGVar9->eval_start_face_index + uVar19) % uVar21;
          pVVar17 = (pGVar9->ring).data + uVar32;
          fVar55 = (pGVar9->vtx).field_0.m128[0] + (pVVar17->field_0).m128[0];
          fVar56 = (pGVar9->vtx).field_0.m128[1] + (pVVar17->field_0).m128[1];
          fVar57 = (pGVar9->vtx).field_0.m128[2] + (pVVar17->field_0).m128[2];
          fVar58 = (pGVar9->vtx).field_0.m128[3] + (pVVar17->field_0).m128[3];
          if ((0xf < uVar21) &&
             ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)
              patch->items[uVar33].ring.items[0].ring.data == pDVar3)) {
            pVVar17 = (Vec3fa *)alignedMalloc(0x800,0x10);
            patch->items[uVar33].ring.items[0].ring.data = pVVar17;
            lVar30 = 0;
            do {
              puVar5 = (undefined8 *)((long)&pDVar27->arr[0].field_0 + lVar30);
              uVar12 = puVar5[1];
              puVar4 = (undefined8 *)
                       ((long)&(patch->items[uVar33].ring.items[0].ring.data)->field_0 + lVar30);
              *puVar4 = *puVar5;
              puVar4[1] = uVar12;
              lVar30 = lVar30 + 0x10;
            } while (lVar30 != 0x200);
          }
          pVVar7 = patch->items[uVar33].ring.items[0].ring.data;
          pVVar17 = pVVar7 + uVar21 * 2 + 1;
          fVar39 = (pVVar17->field_0).m128[0];
          fVar44 = (pVVar17->field_0).m128[1];
          fVar45 = (pVVar17->field_0).m128[2];
          fVar46 = (pVVar17->field_0).m128[3];
          if (uVar21 == 0) {
            uVar26 = patch->items[uVar33].ring.items[0].edge_valence;
            if ((0x20 < uVar26) &&
               ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar7 == pDVar3)) {
              pVVar17 = (Vec3fa *)alignedMalloc(0x800,0x10);
              patch->items[uVar33].ring.items[0].ring.data = pVVar17;
              lVar30 = 0;
              do {
                puVar5 = (undefined8 *)((long)&pDVar27->arr[0].field_0 + lVar30);
                uVar12 = puVar5[1];
                puVar4 = (undefined8 *)
                         ((long)&(patch->items[uVar33].ring.items[0].ring.data)->field_0 + lVar30);
                *puVar4 = *puVar5;
                puVar4[1] = uVar12;
                lVar30 = lVar30 + 0x10;
              } while (lVar30 != 0x200);
            }
            pVVar17 = patch->items[uVar33].ring.items[0].ring.data + (uVar26 - 1);
          }
          else {
            if ((0x10 < uVar21) &&
               ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar7 == pDVar3)) {
              pVVar17 = (Vec3fa *)alignedMalloc(0x800,0x10);
              patch->items[uVar33].ring.items[0].ring.data = pVVar17;
              lVar30 = 0;
              do {
                puVar5 = (undefined8 *)((long)&pDVar27->arr[0].field_0 + lVar30);
                uVar12 = puVar5[1];
                puVar4 = (undefined8 *)
                         ((long)&(patch->items[uVar33].ring.items[0].ring.data)->field_0 + lVar30);
                *puVar4 = *puVar5;
                puVar4[1] = uVar12;
                lVar30 = lVar30 + 0x10;
              } while (lVar30 != 0x200);
            }
            pVVar17 = patch->items[uVar33].ring.items[0].ring.data + uVar21 * 2 + -1;
          }
          fVar39 = fVar39 + (pVVar17->field_0).m128[0];
          fVar44 = fVar44 + (pVVar17->field_0).m128[1];
          fVar45 = fVar45 + (pVVar17->field_0).m128[2];
          fVar46 = fVar46 + (pVVar17->field_0).m128[3];
          pVVar17 = (pGVar9->ring).data + uVar32;
          fVar36 = fVar36 + (pVVar17->field_0).m128[0];
          fVar49 = fVar49 + (pVVar17->field_0).m128[1];
          fVar50 = fVar50 + (pVVar17->field_0).m128[2];
          fVar51 = fVar51 + (pVVar17->field_0).m128[3];
          fVar38 = (pGVar9->faces).data[uVar21].crease_weight + -1.0;
          if ((0xf < uVar21) &&
             ((DynamicStackArray<float,_16UL,_64UL> *)
              patch->items[uVar33].ring.items[0].crease_weight.data ==
              &patch->items[uVar33].ring.items[0].crease_weight)) {
            pfVar18 = (float *)operator_new__(0x100);
            patch->items[uVar33].ring.items[0].crease_weight.data = pfVar18;
            lVar30 = 0;
            do {
              patch->items[uVar33].ring.items[0].crease_weight.data[lVar30] = pDVar25->arr[lVar30];
              lVar30 = lVar30 + 1;
            } while (lVar30 != 0x10);
          }
          fVar40 = 0.0;
          if (0.0 <= fVar38) {
            fVar40 = fVar38;
          }
          patch->items[uVar33].ring.items[0].crease_weight.data[uVar21] = fVar40;
          if (0.0 < (pGVar9->faces).data[uVar21].crease_weight) {
            pVVar17 = (pGVar9->ring).data + uVar32;
            fVar37 = fVar37 + (pVVar17->field_0).m128[0];
            fVar52 = fVar52 + (pVVar17->field_0).m128[1];
            fVar53 = fVar53 + (pVVar17->field_0).m128[2];
            fVar54 = fVar54 + (pVVar17->field_0).m128[3];
            (&local_238)[uVar22] = uVar21;
            uVar24 = uVar21 * 2 | 1;
            if ((0x20 < uVar24) &&
               ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)
                patch->items[uVar33].ring.items[0].ring.data == pDVar3)) {
              pVVar17 = (Vec3fa *)alignedMalloc(0x800,0x10);
              patch->items[uVar33].ring.items[0].ring.data = pVVar17;
              lVar30 = 0;
              do {
                puVar5 = (undefined8 *)((long)&pDVar27->arr[0].field_0 + lVar30);
                uVar12 = puVar5[1];
                puVar4 = (undefined8 *)
                         ((long)&(patch->items[uVar33].ring.items[0].ring.data)->field_0 + lVar30);
                *puVar4 = *puVar5;
                puVar4[1] = uVar12;
                lVar30 = lVar30 + 0x10;
              } while (lVar30 != 0x200);
            }
            uVar22 = uVar22 + 1;
            pVVar17 = patch->items[uVar33].ring.items[0].ring.data + uVar21 * 2;
            (pVVar17->field_0).m128[0] = fVar55 * 0.5;
            (pVVar17->field_0).m128[1] = fVar56 * 0.5;
            (pVVar17->field_0).m128[2] = fVar57 * 0.5;
            (pVVar17->field_0).m128[3] = fVar58 * 0.5;
            fVar38 = (pGVar9->faces).data[uVar21].crease_weight;
            if (fVar38 < 1.0) {
              fVar40 = 1.0 - fVar38;
              fVar55 = (fVar55 + fVar39) * 0.25 * fVar40 + fVar55 * 0.5 * fVar38;
              fVar56 = (fVar56 + fVar44) * 0.25 * fVar40 + fVar56 * 0.5 * fVar38;
              fVar57 = (fVar57 + fVar45) * 0.25 * fVar40 + fVar57 * 0.5 * fVar38;
              fVar58 = (fVar58 + fVar46) * 0.25 * fVar40 + fVar58 * 0.5 * fVar38;
              if ((0x20 < uVar24) &&
                 ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)
                  patch->items[uVar33].ring.items[0].ring.data == pDVar3)) {
                pVVar17 = (Vec3fa *)alignedMalloc(0x800,0x10);
                patch->items[uVar33].ring.items[0].ring.data = pVVar17;
                lVar30 = 0;
                do {
                  puVar5 = (undefined8 *)((long)&pDVar27->arr[0].field_0 + lVar30);
                  uVar12 = puVar5[1];
                  puVar4 = (undefined8 *)
                           ((long)&(patch->items[uVar33].ring.items[0].ring.data)->field_0 + lVar30)
                  ;
                  *puVar4 = *puVar5;
                  puVar4[1] = uVar12;
                  lVar30 = lVar30 + 0x10;
                } while (lVar30 != 0x200);
              }
              goto LAB_00e5801f;
            }
          }
          else {
            fVar55 = (fVar55 + fVar39) * 0.25;
            fVar56 = (fVar56 + fVar44) * 0.25;
            fVar57 = (fVar57 + fVar45) * 0.25;
            fVar58 = (fVar58 + fVar46) * 0.25;
            if ((0x20 < (uVar21 * 2 | 1)) &&
               ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)
                patch->items[uVar33].ring.items[0].ring.data == pDVar3)) {
              pVVar17 = (Vec3fa *)alignedMalloc(0x800,0x10);
              patch->items[uVar33].ring.items[0].ring.data = pVVar17;
              lVar30 = 0;
              do {
                puVar5 = (undefined8 *)((long)&pDVar27->arr[0].field_0 + lVar30);
                uVar12 = puVar5[1];
                puVar4 = (undefined8 *)
                         ((long)&(patch->items[uVar33].ring.items[0].ring.data)->field_0 + lVar30);
                *puVar4 = *puVar5;
                puVar4[1] = uVar12;
                lVar30 = lVar30 + 0x10;
              } while (lVar30 != 0x200);
            }
LAB_00e5801f:
            pVVar17 = patch->items[uVar33].ring.items[0].ring.data + uVar21 * 2;
            (pVVar17->field_0).m128[0] = fVar55;
            (pVVar17->field_0).m128[1] = fVar56;
            (pVVar17->field_0).m128[2] = fVar57;
            (pVVar17->field_0).m128[3] = fVar58;
          }
          uVar32 = (uVar32 + (long)(pGVar9->faces).data[uVar21].size) % (ulong)pGVar9->edge_valence;
          uVar19 = uVar19 + 1;
          uVar21 = (ulong)pGVar9->face_valence;
        } while (uVar19 < uVar21);
      }
      lVar13 = local_230;
      lVar30 = local_238;
      fVar56 = 1.0 / (float)uVar21;
      fVar55 = (float)uVar21 + -2.0;
      fVar57 = (fVar36 * fVar56 + fVar55 * (pGVar9->vtx).field_0.m128[0]) * fVar56;
      fVar49 = (fVar49 * fVar56 + fVar55 * (pGVar9->vtx).field_0.m128[1]) * fVar56;
      fVar50 = (fVar50 * fVar56 + fVar55 * (pGVar9->vtx).field_0.m128[2]) * fVar56;
      fVar56 = (fVar51 * fVar56 + fVar55 * (pGVar9->vtx).field_0.m128[3]) * fVar56;
      patch->items[uVar33].ring.items[0].vtx.field_0.m128[0] = fVar57;
      patch->items[uVar33].ring.items[0].vtx.field_0.m128[1] = fVar49;
      patch->items[uVar33].ring.items[0].vtx.field_0.m128[2] = fVar50;
      patch->items[uVar33].ring.items[0].vtx.field_0.m128[3] = fVar56;
      fVar36 = pGVar9->vertex_crease_weight;
      if (0.0 < fVar36) {
        if (1.0 <= fVar36) {
          fVar51 = (pGVar9->vtx).field_0.m128[0];
          fVar55 = (pGVar9->vtx).field_0.m128[1];
          fVar58 = (pGVar9->vtx).field_0.m128[2];
          fVar36 = (pGVar9->vtx).field_0.m128[3];
        }
        else {
          fVar37 = 1.0 - fVar36;
          fVar51 = fVar37 * (pGVar9->vtx).field_0.m128[0] + fVar57 * fVar36;
          fVar55 = fVar37 * (pGVar9->vtx).field_0.m128[1] + fVar49 * fVar36;
          fVar58 = fVar37 * (pGVar9->vtx).field_0.m128[2] + fVar50 * fVar36;
          fVar36 = fVar37 * (pGVar9->vtx).field_0.m128[3] + fVar56 * fVar36;
        }
LAB_00e589e9:
        patch->items[uVar33].ring.items[0].vtx.field_0.m128[0] = fVar51;
        patch->items[uVar33].ring.items[0].vtx.field_0.m128[1] = fVar55;
        patch->items[uVar33].ring.items[0].vtx.field_0.m128[2] = fVar58;
        patch->items[uVar33].ring.items[0].vtx.field_0.m128[3] = fVar36;
      }
      else if (1 < uVar22) {
        fVar51 = (pGVar9->vtx).field_0.m128[0];
        fVar55 = (pGVar9->vtx).field_0.m128[1];
        fVar58 = (pGVar9->vtx).field_0.m128[2];
        fVar36 = (pGVar9->vtx).field_0.m128[3];
        if (uVar22 == 2) {
          fVar39 = (fVar37 + fVar51 * 6.0) * 0.125;
          fVar52 = (fVar52 + fVar55 * 6.0) * 0.125;
          fVar53 = (fVar53 + fVar58 * 6.0) * 0.125;
          fVar54 = (fVar54 + fVar36 * 6.0) * 0.125;
          pFVar8 = (pGVar9->faces).data;
          fVar36 = pFVar8[local_238].crease_weight;
          fVar51 = pFVar8[local_230].crease_weight;
          patch->items[uVar33].ring.items[0].vtx.field_0.m128[0] = fVar39;
          patch->items[uVar33].ring.items[0].vtx.field_0.m128[1] = fVar52;
          patch->items[uVar33].ring.items[0].vtx.field_0.m128[2] = fVar53;
          patch->items[uVar33].ring.items[0].vtx.field_0.m128[3] = fVar54;
          fVar37 = (fVar36 * 3.0 + fVar51) * 0.25 + -1.0;
          pDVar1 = &patch->items[uVar33].ring.items[0].crease_weight;
          if ((0x10 < local_238 + 1U) &&
             ((DynamicStackArray<float,_16UL,_64UL> *)
              patch->items[uVar33].ring.items[0].crease_weight.data == pDVar1)) {
            pfVar18 = (float *)operator_new__(0x100);
            patch->items[uVar33].ring.items[0].crease_weight.data = pfVar18;
            lVar16 = 0;
            do {
              patch->items[uVar33].ring.items[0].crease_weight.data[lVar16] = pDVar25->arr[lVar16];
              lVar16 = lVar16 + 1;
            } while (lVar16 != 0x10);
          }
          fVar55 = 0.0;
          if (0.0 <= fVar37) {
            fVar55 = fVar37;
          }
          patch->items[uVar33].ring.items[0].crease_weight.data[lVar30] = fVar55;
          fVar37 = (fVar51 * 3.0 + fVar36) * 0.25 + -1.0;
          if ((0x10 < lVar13 + 1U) &&
             ((DynamicStackArray<float,_16UL,_64UL> *)
              patch->items[uVar33].ring.items[0].crease_weight.data == pDVar1)) {
            pfVar18 = (float *)operator_new__(0x100);
            patch->items[uVar33].ring.items[0].crease_weight.data = pfVar18;
            lVar30 = 0;
            do {
              patch->items[uVar33].ring.items[0].crease_weight.data[lVar30] = pDVar25->arr[lVar30];
              lVar30 = lVar30 + 1;
            } while (lVar30 != 0x10);
          }
          fVar55 = 0.0;
          if (0.0 <= fVar37) {
            fVar55 = fVar37;
          }
          patch->items[uVar33].ring.items[0].crease_weight.data[lVar13] = fVar55;
          fVar36 = (fVar36 + fVar51) * 0.5;
          if (1.0 <= fVar36) goto LAB_00e58836;
          fVar37 = 1.0 - fVar36;
          fVar51 = fVar39 * fVar37 + fVar57 * fVar36;
          fVar55 = fVar52 * fVar37 + fVar49 * fVar36;
          fVar58 = fVar53 * fVar37 + fVar50 * fVar36;
          fVar36 = fVar54 * fVar37 + fVar56 * fVar36;
        }
        goto LAB_00e589e9;
      }
LAB_00e58836:
      uVar22 = uVar33 + 1;
      patch->items[uVar33].ring.items[0].edge_level = (this->ring).data[uVar33].edge_level * 0.5;
      uVar21 = 0;
      if (uVar22 != uVar28) {
        uVar21 = uVar22 & 0xffffffff;
      }
      patch->items[uVar21].ring.items[3].edge_level = (this->ring).data[uVar33].edge_level * 0.5;
      uVar28 = (ulong)this->N;
      pDVar27 = (DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)((long)(pDVar27 + 5) + 0x1c0);
      pDVar25 = pDVar25 + 0x1a;
      uVar33 = uVar22;
    } while (uVar22 < uVar28);
  }
  uVar28 = (ulong)this->N;
  if (this->N == 0) {
    fVar36 = 2.0;
    auVar47 = ZEXT816(0);
  }
  else {
    ppVVar20 = &patch->items[0].ring.items[1].ring.data;
    uVar26 = 1;
    iVar34 = -1;
    lVar30 = 0;
    uVar33 = 1;
    auVar42 = ZEXT816(0);
    fVar49 = 2.0;
    do {
      uVar21 = uVar33 & 0xffffffff;
      if (uVar33 == uVar28) {
        uVar21 = 0;
      }
      pGVar9 = (this->ring).data;
      if ((*(int *)((long)&pGVar9->border_face + lVar30) ==
           *(int *)((long)&pGVar9->face_valence + lVar30) + -1) || (pGVar9[uVar21].face_valence < 3)
         ) {
        pCVar23 = patch->items + uVar21;
        *(float *)(ppVVar20 + -0x48) = *(float *)((long)ppVVar20 + -0x57c);
        patch->items[uVar21].ring.items[3].vertex_level = *(float *)((long)ppVVar20 + -0x57c);
        *(undefined4 *)((long)ppVVar20 + -0x2fc) = 3;
        patch->items[uVar21].ring.items[3].face_valence = 3;
        *(undefined4 *)(ppVVar20 + -0x5f) = 6;
        patch->items[uVar21].ring.items[3].edge_valence = 6;
        *(undefined4 *)(ppVVar20 + -0x60) = 2;
        patch->items[uVar21].ring.items[3].border_index = 4;
        plVar10 = (long *)ppVVar20[-0x68];
        lVar13 = *plVar10;
        lVar16 = plVar10[1];
        ppVVar20[-0x46] = (Vec3fa *)lVar13;
        ppVVar20[-0x45] = (Vec3fa *)lVar16;
        paVar15 = &patch->items[uVar21].ring;
        *(long *)&paVar15->items[3].vtx.field_0 = lVar13;
        *(long *)((long)&paVar15->items[3].vtx.field_0 + 8) = lVar16;
        *(undefined4 *)((long)ppVVar20 + -0x2f4) = 0;
        patch->items[uVar21].ring.items[3].vertex_crease_weight = 0.0;
        lVar13 = plVar10[2];
        lVar16 = plVar10[3];
        pVVar17 = *ppVVar20;
        *(long *)&pVVar17->field_0 = lVar13;
        *(long *)((long)&pVVar17->field_0 + 8) = lVar16;
        pVVar17 = patch->items[uVar21].ring.items[3].ring.data;
        *(long *)&pVVar17[2].field_0 = lVar13;
        *(long *)((long)&pVVar17[2].field_0 + 8) = lVar16;
        pVVar17 = patch->items[uVar21].ring.items[0].ring.data;
        uVar12 = *(undefined8 *)&pVVar17->field_0;
        uVar14 = *(undefined8 *)((long)&pVVar17->field_0 + 8);
        pVVar17 = *ppVVar20;
        *(undefined8 *)&pVVar17[5].field_0 = uVar12;
        *(undefined8 *)((long)&pVVar17[5].field_0 + 8) = uVar14;
        pVVar17 = patch->items[uVar21].ring.items[3].ring.data;
        *(undefined8 *)&pVVar17[1].field_0 = uVar12;
        *(undefined8 *)((long)&pVVar17[1].field_0 + 8) = uVar14;
        paVar15 = &patch->items[uVar21].ring;
        uVar12 = *(undefined8 *)&paVar15->items[0].vtx.field_0;
        uVar14 = *(undefined8 *)((long)&paVar15->items[0].vtx.field_0 + 8);
        pVVar17 = *ppVVar20;
        *(undefined8 *)&pVVar17[4].field_0 = uVar12;
        *(undefined8 *)((long)&pVVar17[4].field_0 + 8) = uVar14;
        pVVar17 = patch->items[uVar21].ring.items[3].ring.data;
        *(undefined8 *)&pVVar17->field_0 = uVar12;
        *(undefined8 *)((long)&pVVar17->field_0 + 8) = uVar14;
        puVar5 = (undefined8 *)((long)ppVVar20[-0x68] + 0x10 + (long)(int)ppVVar20[-200] * 0x10);
        uVar12 = *puVar5;
        uVar14 = puVar5[1];
        pVVar17 = *ppVVar20;
        *(undefined8 *)&pVVar17[3].field_0 = uVar12;
        *(undefined8 *)((long)&pVVar17[3].field_0 + 8) = uVar14;
        pVVar17 = patch->items[uVar21].ring.items[3].ring.data;
        *(undefined8 *)&pVVar17[5].field_0 = uVar12;
        *(undefined8 *)((long)&pVVar17[5].field_0 + 8) = uVar14;
        lVar13 = (long)ppVVar20[-0xae];
        lVar16 = (long)ppVVar20[-0xad];
        pVVar17 = *ppVVar20;
        *(long *)&pVVar17[2].field_0 = lVar13;
        *(long *)((long)&pVVar17[2].field_0 + 8) = lVar16;
        pVVar17 = patch->items[uVar21].ring.items[3].ring.data;
        *(long *)&pVVar17[4].field_0 = lVar13;
        *(long *)((long)&pVVar17[4].field_0 + 8) = lVar16;
        uVar12 = *(undefined8 *)((long)ppVVar20[-0x68] + 0x20);
        uVar14 = *(undefined8 *)((long)ppVVar20[-0x68] + 0x28);
        pVVar17 = *ppVVar20;
        *(undefined8 *)&pVVar17[1].field_0 = uVar12;
        *(undefined8 *)((long)&pVVar17[1].field_0 + 8) = uVar14;
        pVVar17 = patch->items[uVar21].ring.items[3].ring.data;
        *(undefined8 *)&pVVar17[3].field_0 = uVar12;
        *(undefined8 *)((long)&pVVar17[3].field_0 + 8) = uVar14;
        *(undefined4 *)ppVVar20[-0x50] = 0;
        patch->items[uVar21].ring.items[3].crease_weight.data[1] = 0.0;
        fVar36 = patch->items[uVar21].ring.items[0].crease_weight.data[1];
        *(float *)((long)ppVVar20[-0x50] + 8) = fVar36;
        *patch->items[uVar21].ring.items[3].crease_weight.data = fVar36;
        fVar36 = *(float *)ppVVar20[-0xb8];
        *(float *)((long)ppVVar20[-0x50] + 4) = fVar36;
        patch->items[uVar21].ring.items[3].crease_weight.data[2] = fVar36;
        uVar29 = *(uint *)((long)ppVVar20 + -0x574);
        uVar31 = patch->items[uVar21].ring.items[0].eval_unique_identifier;
        if (uVar29 <= uVar31) {
          *(undefined4 *)(ppVVar20 + -0x47) = 1;
          (pCVar23->ring).items[3].eval_start_index = 2;
          goto LAB_00e59085;
        }
        *(undefined4 *)(ppVVar20 + -0x47) = 2;
        (pCVar23->ring).items[3].eval_start_index = 0;
LAB_00e5904b:
        *(uint *)((long)ppVVar20 + -0x234) = uVar31;
        (pCVar23->ring).items[3].eval_unique_identifier = uVar31;
      }
      else {
        pCVar23 = patch->items + uVar21;
        *(float *)(ppVVar20 + -0x48) = *(float *)((long)ppVVar20 + -0x57c);
        patch->items[uVar21].ring.items[3].vertex_level = *(float *)((long)ppVVar20 + -0x57c);
        *(undefined4 *)((long)ppVVar20 + -0x2fc) = 4;
        patch->items[uVar21].ring.items[3].face_valence = 4;
        *(undefined4 *)(ppVVar20 + -0x5f) = 8;
        patch->items[uVar21].ring.items[3].edge_valence = 8;
        *(undefined4 *)(ppVVar20 + -0x60) = 0xffffffff;
        patch->items[uVar21].ring.items[3].border_index = -1;
        plVar10 = (long *)ppVVar20[-0x68];
        lVar13 = *plVar10;
        lVar16 = plVar10[1];
        ppVVar20[-0x46] = (Vec3fa *)lVar13;
        ppVVar20[-0x45] = (Vec3fa *)lVar16;
        paVar15 = &patch->items[uVar21].ring;
        *(long *)&paVar15->items[3].vtx.field_0 = lVar13;
        *(long *)((long)&paVar15->items[3].vtx.field_0 + 8) = lVar16;
        *(undefined4 *)((long)ppVVar20 + -0x2f4) = 0;
        patch->items[uVar21].ring.items[3].vertex_crease_weight = 0.0;
        lVar13 = plVar10[2];
        lVar16 = plVar10[3];
        pVVar17 = *ppVVar20;
        *(long *)&pVVar17->field_0 = lVar13;
        *(long *)((long)&pVVar17->field_0 + 8) = lVar16;
        pVVar17 = patch->items[uVar21].ring.items[3].ring.data;
        *(long *)&pVVar17[2].field_0 = lVar13;
        *(long *)((long)&pVVar17[2].field_0 + 8) = lVar16;
        pVVar17 = patch->items[uVar21].ring.items[0].ring.data;
        uVar12 = *(undefined8 *)&pVVar17->field_0;
        uVar14 = *(undefined8 *)((long)&pVVar17->field_0 + 8);
        pVVar17 = *ppVVar20;
        *(undefined8 *)&pVVar17[7].field_0 = uVar12;
        *(undefined8 *)((long)&pVVar17[7].field_0 + 8) = uVar14;
        pVVar17 = patch->items[uVar21].ring.items[3].ring.data;
        *(undefined8 *)&pVVar17[1].field_0 = uVar12;
        *(undefined8 *)((long)&pVVar17[1].field_0 + 8) = uVar14;
        paVar15 = &patch->items[uVar21].ring;
        uVar12 = *(undefined8 *)&paVar15->items[0].vtx.field_0;
        uVar14 = *(undefined8 *)((long)&paVar15->items[0].vtx.field_0 + 8);
        pVVar17 = *ppVVar20;
        *(undefined8 *)&pVVar17[6].field_0 = uVar12;
        *(undefined8 *)((long)&pVVar17[6].field_0 + 8) = uVar14;
        pVVar17 = patch->items[uVar21].ring.items[3].ring.data;
        *(undefined8 *)&pVVar17->field_0 = uVar12;
        *(undefined8 *)((long)&pVVar17->field_0 + 8) = uVar14;
        pVVar17 = patch->items[uVar21].ring.items[0].ring.data;
        uVar12 = *(undefined8 *)&pVVar17[4].field_0;
        uVar14 = *(undefined8 *)((long)&pVVar17[4].field_0 + 8);
        pVVar17 = *ppVVar20;
        *(undefined8 *)&pVVar17[5].field_0 = uVar12;
        *(undefined8 *)((long)&pVVar17[5].field_0 + 8) = uVar14;
        pVVar17 = patch->items[uVar21].ring.items[3].ring.data;
        *(undefined8 *)&pVVar17[7].field_0 = uVar12;
        *(undefined8 *)((long)&pVVar17[7].field_0 + 8) = uVar14;
        puVar5 = (undefined8 *)((long)ppVVar20[-0x68] + (ulong)((int)ppVVar20[-199] - 1) * 0x10);
        uVar12 = *puVar5;
        uVar14 = puVar5[1];
        pVVar17 = *ppVVar20;
        *(undefined8 *)&pVVar17[4].field_0 = uVar12;
        *(undefined8 *)((long)&pVVar17[4].field_0 + 8) = uVar14;
        pVVar17 = patch->items[uVar21].ring.items[3].ring.data;
        *(undefined8 *)&pVVar17[6].field_0 = uVar12;
        *(undefined8 *)((long)&pVVar17[6].field_0 + 8) = uVar14;
        puVar5 = (undefined8 *)((long)ppVVar20[-0x68] + (ulong)((int)ppVVar20[-199] - 2) * 0x10);
        uVar12 = *puVar5;
        uVar14 = puVar5[1];
        pVVar17 = *ppVVar20;
        *(undefined8 *)&pVVar17[3].field_0 = uVar12;
        *(undefined8 *)((long)&pVVar17[3].field_0 + 8) = uVar14;
        pVVar17 = patch->items[uVar21].ring.items[3].ring.data;
        *(undefined8 *)&pVVar17[5].field_0 = uVar12;
        *(undefined8 *)((long)&pVVar17[5].field_0 + 8) = uVar14;
        lVar13 = (long)ppVVar20[-0xae];
        lVar16 = (long)ppVVar20[-0xad];
        pVVar17 = *ppVVar20;
        *(long *)&pVVar17[2].field_0 = lVar13;
        *(long *)((long)&pVVar17[2].field_0 + 8) = lVar16;
        pVVar17 = patch->items[uVar21].ring.items[3].ring.data;
        *(long *)&pVVar17[4].field_0 = lVar13;
        *(long *)((long)&pVVar17[4].field_0 + 8) = lVar16;
        uVar12 = *(undefined8 *)((long)ppVVar20[-0x68] + 0x20);
        uVar14 = *(undefined8 *)((long)ppVVar20[-0x68] + 0x28);
        pVVar17 = *ppVVar20;
        *(undefined8 *)&pVVar17[1].field_0 = uVar12;
        *(undefined8 *)((long)&pVVar17[1].field_0 + 8) = uVar14;
        pVVar17 = patch->items[uVar21].ring.items[3].ring.data;
        *(undefined8 *)&pVVar17[3].field_0 = uVar12;
        *(undefined8 *)((long)&pVVar17[3].field_0 + 8) = uVar14;
        *(undefined4 *)ppVVar20[-0x50] = 0;
        patch->items[uVar21].ring.items[3].crease_weight.data[1] = 0.0;
        fVar36 = patch->items[uVar21].ring.items[0].crease_weight.data[1];
        *(float *)((long)ppVVar20[-0x50] + 0xc) = fVar36;
        *patch->items[uVar21].ring.items[3].crease_weight.data = fVar36;
        *(undefined4 *)((long)ppVVar20[-0x50] + 8) = 0;
        patch->items[uVar21].ring.items[3].crease_weight.data[3] = 0.0;
        fVar36 = *(float *)ppVVar20[-0xb8];
        *(float *)((long)ppVVar20[-0x50] + 4) = fVar36;
        patch->items[uVar21].ring.items[3].crease_weight.data[2] = fVar36;
        uVar29 = *(uint *)((long)ppVVar20 + -0x574);
        uVar31 = patch->items[uVar21].ring.items[0].eval_unique_identifier;
        if (uVar31 < uVar29) {
          *(undefined4 *)(ppVVar20 + -0x47) = 1;
          (pCVar23->ring).items[3].eval_start_index = 2;
          goto LAB_00e5904b;
        }
        *(undefined4 *)(ppVVar20 + -0x47) = 3;
        (pCVar23->ring).items[3].eval_start_index = 0;
LAB_00e59085:
        *(uint *)((long)ppVVar20 + -0x234) = uVar29;
        (pCVar23->ring).items[3].eval_unique_identifier = uVar29;
      }
      pGVar9 = (this->ring).data;
      fVar36 = (pGVar9[(ulong)(uint)((int)uVar28 + iVar34) % uVar28].edge_level +
               pGVar9[uVar21].edge_level) * 0.25;
      patch->items[uVar21].ring.items[2].edge_level = fVar36;
      *(float *)((long)ppVVar20 + -0x23c) = fVar36;
      if (fVar36 <= fVar49) {
        fVar36 = fVar49;
      }
      pfVar18 = (float *)((long)((((this->ring).data)->ring).arr + -4) + lVar30);
      auVar47._0_4_ = auVar42._0_4_ + *pfVar18;
      auVar47._4_4_ = auVar42._4_4_ + pfVar18[1];
      auVar47._8_4_ = auVar42._8_4_ + pfVar18[2];
      auVar47._12_4_ = auVar42._12_4_ + pfVar18[3];
      lVar13 = (long)ppVVar20[-0xad];
      (&local_238)[(ulong)(uVar26 - 1) * 2] = ppVVar20[-0xae];
      *(long *)(afStack_228 + ((ulong)(uVar26 - 1) * 2 + -1) * 2) = lVar13;
      uVar12 = *(undefined8 *)((long)ppVVar20[-0x68] + 8);
      (&local_238)[(ulong)uVar26 * 2] = *(undefined8 *)ppVVar20[-0x68];
      *(undefined8 *)(afStack_228 + ((ulong)uVar26 * 2 + -1) * 2) = uVar12;
      uVar28 = (ulong)this->N;
      lVar30 = lVar30 + 0x380;
      ppVVar20 = ppVVar20 + 0x1a0;
      iVar34 = iVar34 + 1;
      uVar26 = uVar26 + 2;
      bVar35 = uVar33 < uVar28;
      uVar33 = uVar33 + 1;
      auVar42 = auVar47;
      fVar49 = fVar36;
    } while (bVar35);
  }
  uVar33 = (ulong)this->N;
  if (this->N != 0) {
    fVar49 = (float)uVar28;
    auVar11._4_4_ = fVar49;
    auVar11._0_4_ = fVar49;
    auVar11._8_4_ = fVar49;
    auVar11._12_4_ = fVar49;
    aVar48 = (anon_union_16_2_47237d3f_for_Vec3fa_0)divps(auVar47,auVar11);
    pDVar27 = &patch->items[0].ring.items[2].ring;
    pDVar25 = &patch->items[0].ring.items[2].crease_weight;
    uVar28 = 0;
    do {
      patch->items[uVar28].ring.items[2].vertex_level = fVar36;
      uVar29 = (uint)uVar33;
      patch->items[uVar28].ring.items[2].face_valence = uVar29;
      uVar26 = uVar29 * 2;
      patch->items[uVar28].ring.items[2].edge_valence = uVar26;
      patch->items[uVar28].ring.items[2].border_index = -1;
      patch->items[uVar28].ring.items[2].vtx.field_0 = aVar48;
      patch->items[uVar28].ring.items[2].vertex_crease_weight = 0.0;
      if (uVar26 != 0) {
        uVar33 = 0;
        do {
          uVar21 = (ulong)((int)uVar28 * 2 + uVar26 + -1 + (int)uVar33) % (ulong)uVar26;
          fVar49 = *(float *)(&local_238 + uVar21 * 2);
          fVar50 = *(float *)((long)&local_238 + uVar21 * 0x10 + 4);
          fVar51 = afStack_228[(uVar21 * 2 + -1) * 2];
          fVar37 = afStack_228[uVar21 * 4 + -1];
          if ((0x1f < uVar33) &&
             ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)
              patch->items[uVar28].ring.items[2].ring.data ==
              &patch->items[uVar28].ring.items[2].ring)) {
            pVVar17 = (Vec3fa *)alignedMalloc(0x800,0x10);
            patch->items[uVar28].ring.items[2].ring.data = pVVar17;
            lVar30 = 0;
            do {
              puVar5 = (undefined8 *)((long)&pDVar27->arr[0].field_0 + lVar30);
              uVar12 = puVar5[1];
              puVar4 = (undefined8 *)
                       ((long)&(patch->items[uVar28].ring.items[2].ring.data)->field_0 + lVar30);
              *puVar4 = *puVar5;
              puVar4[1] = uVar12;
              lVar30 = lVar30 + 0x10;
            } while (lVar30 != 0x200);
          }
          uVar21 = uVar33 + 1;
          pVVar17 = patch->items[uVar28].ring.items[2].ring.data + uVar33;
          (pVVar17->field_0).m128[0] = fVar49;
          (pVVar17->field_0).m128[1] = fVar50;
          (pVVar17->field_0).m128[2] = fVar51;
          (pVVar17->field_0).m128[3] = fVar37;
          uVar33 = uVar21;
        } while (uVar21 != uVar26);
      }
      uVar33 = 0;
      do {
        if ((0xf < uVar33) &&
           ((DynamicStackArray<float,_16UL,_64UL> *)
            patch->items[uVar28].ring.items[2].crease_weight.data ==
            &patch->items[uVar28].ring.items[2].crease_weight)) {
          pfVar18 = (float *)operator_new__(0x100);
          patch->items[uVar28].ring.items[2].crease_weight.data = pfVar18;
          lVar30 = 0;
          do {
            patch->items[uVar28].ring.items[2].crease_weight.data[lVar30] = pDVar25->arr[lVar30];
            lVar30 = lVar30 + 1;
          } while (lVar30 != 0x10);
        }
        patch->items[uVar28].ring.items[2].crease_weight.data[uVar33] = 0.0;
        uVar33 = uVar33 + 1;
      } while (uVar33 != uVar29 + (uVar29 == 0));
      uVar26 = uVar26 + (int)uVar28 * -2 >> 1;
      patch->items[uVar28].ring.items[2].eval_start_index = uVar26;
      puVar2 = &patch->items[uVar28].ring.items[2].face_valence;
      if (*puVar2 <= uVar26) {
        patch->items[uVar28].ring.items[2].eval_start_index = uVar26 - *puVar2;
      }
      patch->items[uVar28].ring.items[2].eval_unique_identifier = 0;
      uVar28 = uVar28 + 1;
      uVar33 = (ulong)this->N;
      pDVar27 = (DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)((long)(pDVar27 + 5) + 0x1c0);
      pDVar25 = pDVar25 + 0x1a;
    } while (uVar28 < uVar33);
  }
  return;
}

Assistant:

__noinline void subdivide(array_t<CatmullClarkPatch,SIZE>& patch, unsigned& N_o) const
    {
      N_o = N;
      assert( N );
      for (unsigned i=0; i<N; i++) {
        unsigned ip1 = (i+1)%N; // FIXME: %
        ring[i].subdivide(patch[i].ring[0]);
        patch[i]  .ring[0].edge_level = 0.5f*ring[i].edge_level;
        patch[ip1].ring[3].edge_level = 0.5f*ring[i].edge_level;
        
	assert( patch[i].ring[0].hasValidPositions() );
        
      }
      assert(N < 2*SIZE);
      Vertex_t center = Vertex_t(0.0f);
      array_t<Vertex_t,2*SIZE> center_ring;
      float center_vertex_level = 2.0f; // guarantees that irregular vertices get always isolated also for non-quads
      
      for (unsigned i=0; i<N; i++)
      {
        unsigned ip1 = (i+1)%N; // FIXME: %
        unsigned im1 = (i+N-1)%N; // FIXME: %
        bool regular = ring[i].has_last_face() && ring[ip1].face_valence > 2;
        if (likely(regular)) init_regular(patch[i].ring[0],patch[ip1].ring[0],patch[i].ring[1],patch[ip1].ring[3]); 
        else                 init_border (patch[i].ring[0],patch[ip1].ring[0],patch[i].ring[1],patch[ip1].ring[3]);
        
	assert( patch[i].ring[1].hasValidPositions() );
	assert( patch[ip1].ring[3].hasValidPositions() );
        
	float level = 0.25f*(ring[im1].edge_level+ring[ip1].edge_level);
        patch[i].ring[1].edge_level = patch[ip1].ring[2].edge_level = level;
	center_vertex_level = max(center_vertex_level,level);
        
        center += ring[i].vtx;
        center_ring[2*i+0] = (Vertex_t)patch[i].ring[0].vtx;
        center_ring[2*i+1] = (Vertex_t)patch[i].ring[0].ring[0];
      }
      center /= float(N);
      
      for (unsigned int i=0; i<N; i++) {
        init_regular(center,center_ring,center_vertex_level,N,2*i,patch[i].ring[2]);
        
	assert( patch[i].ring[2].hasValidPositions() );
      }
    }